

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mismatch_suite.cpp
# Opt level: O0

void test_array(void)

{
  bool bVar1;
  size_type in_RCX;
  basic_variable<std::allocator<char>_> *pbVar2;
  char *pcVar3;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_03;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_04;
  basic_variable<std::allocator<char>_> *local_a10;
  basic_variable<std::allocator<char>_> *local_9f8;
  basic_variable<std::allocator<char>_> *local_9d0;
  basic_variable<std::allocator<char>_> *local_9b8;
  basic_variable<std::allocator<char>_> *local_990;
  basic_variable<std::allocator<char>_> *local_978;
  undefined4 local_96c;
  iterator local_968;
  iterator local_950;
  difference_type local_938 [2];
  iterator local_928;
  iterator local_910;
  iterator local_8f8;
  undefined1 local_8e0 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  range_2;
  basic_variable<std::allocator<char>_> local_8a8;
  basic_variable<std::allocator<char>_> local_878;
  basic_variable<std::allocator<char>_> local_848;
  basic_variable<std::allocator<char>_> local_818;
  basic_variable<std::allocator<char>_> local_7e8;
  undefined1 local_7b8 [24];
  variable second_2;
  basic_variable<std::allocator<char>_> local_768;
  basic_variable<std::allocator<char>_> local_738;
  basic_variable<std::allocator<char>_> local_708;
  basic_variable<std::allocator<char>_> local_6d8;
  basic_variable<std::allocator<char>_> local_6a8;
  undefined1 local_678 [24];
  variable first_2;
  iterator local_630;
  iterator local_618;
  iterator local_600;
  iterator local_5e8;
  undefined1 local_5d0 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  range_1;
  basic_variable<std::allocator<char>_> local_598;
  basic_variable<std::allocator<char>_> local_568;
  basic_variable<std::allocator<char>_> local_538;
  basic_variable<std::allocator<char>_> local_508;
  basic_variable<std::allocator<char>_> local_4d8;
  undefined1 local_4a8 [24];
  variable second_1;
  basic_variable<std::allocator<char>_> local_458;
  basic_variable<std::allocator<char>_> local_428;
  basic_variable<std::allocator<char>_> local_3f8;
  basic_variable<std::allocator<char>_> local_3c8;
  basic_variable<std::allocator<char>_> local_398;
  undefined1 local_368 [24];
  variable first_1;
  iterator local_320;
  iterator local_308;
  iterator local_2f0;
  iterator local_2d8;
  undefined1 local_2c0 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  range;
  basic_variable<std::allocator<char>_> local_288;
  basic_variable<std::allocator<char>_> local_258;
  basic_variable<std::allocator<char>_> local_228;
  basic_variable<std::allocator<char>_> local_1f8;
  basic_variable<std::allocator<char>_> local_1c8;
  undefined1 local_198 [24];
  variable second;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable first;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_138,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_108,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_d8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,L"bravo");
  local_48._0_8_ = &local_138;
  local_48._8_8_ = 5;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x5;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  pbVar2 = &local_138;
  local_978 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_978 = local_978 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_978);
  } while (local_978 != pbVar2);
  range.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_288;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)
             range.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,true);
  range.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_258;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)
             range.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,2);
  range.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_228;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)
             range.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,3.0);
  range.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_1f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             range.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,"alpha");
  range.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_1c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             range.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,L"bravo");
  local_198._0_8_ = &local_288;
  local_198._8_8_ = 5;
  init_00._M_len = (size_type)pbVar2;
  init_00._M_array = (iterator)0x5;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_198 + 0x10),
             (basic_array<std::allocator<char>_> *)local_198._0_8_,init_00);
  local_990 = (basic_variable<std::allocator<char>_> *)local_198;
  do {
    local_990 = local_990 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_990);
  } while (local_990 != &local_288);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2d8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2f0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_308,(basic_variable<std::allocator<char>_> *)(local_198 + 0x10));
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_2c0,&local_2d8,&local_2f0,&local_308);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_308);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_320,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_2c0,&local_320);
  pcVar3 = "void test_array()";
  boost::detail::test_impl
            ("range.first == first.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x2c1,"void test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_320);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_2c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_198 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_458,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_428,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_3f8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3c8,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_398,L"bravo");
  local_368._0_8_ = &local_458;
  local_368._8_8_ = 5;
  init_01._M_len = (size_type)pcVar3;
  init_01._M_array = (iterator)0x5;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_368 + 0x10),
             (basic_array<std::allocator<char>_> *)local_368._0_8_,init_01);
  pbVar2 = &local_458;
  local_9b8 = (basic_variable<std::allocator<char>_> *)local_368;
  do {
    local_9b8 = local_9b8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9b8);
  } while (local_9b8 != pbVar2);
  range_1.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_598;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)
             range_1.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,1);
  range_1.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_568;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)
             range_1.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,2);
  range_1.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_538;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)
             range_1.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,3);
  range_1.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_508;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             range_1.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,"alpha");
  range_1.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_4d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             range_1.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,L"bravo");
  local_4a8._0_8_ = &local_598;
  local_4a8._8_8_ = 5;
  init_02._M_len = (size_type)pbVar2;
  init_02._M_array = (iterator)0x5;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_4a8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_4a8._0_8_,init_02);
  local_9d0 = (basic_variable<std::allocator<char>_> *)local_4a8;
  do {
    local_9d0 = local_9d0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9d0);
  } while (local_9d0 != &local_598);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5e8,(basic_variable<std::allocator<char>_> *)(local_368 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_600,(basic_variable<std::allocator<char>_> *)(local_368 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_618,(basic_variable<std::allocator<char>_> *)(local_4a8 + 0x10));
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_5d0,&local_5e8,&local_600,&local_618);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_618);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_600);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_630,(basic_variable<std::allocator<char>_> *)(local_368 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_5d0,&local_630);
  pcVar3 = "void test_array()";
  boost::detail::test_impl
            ("range.first == first.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x2c7,"void test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_630);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_5d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_4a8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_368 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_768,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_738,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_708,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6d8,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6a8,L"bravo");
  local_678._0_8_ = &local_768;
  local_678._8_8_ = 5;
  init_03._M_len = (size_type)pcVar3;
  init_03._M_array = (iterator)0x5;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_678 + 0x10),
             (basic_array<std::allocator<char>_> *)local_678._0_8_,init_03);
  pbVar2 = &local_768;
  local_9f8 = (basic_variable<std::allocator<char>_> *)local_678;
  do {
    local_9f8 = local_9f8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9f8);
  } while (local_9f8 != pbVar2);
  range_2.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_8a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)
             range_2.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,true);
  range_2.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_878;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)
             range_2.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,3.0);
  range_2.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_848;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)
             range_2.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,2);
  range_2.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_818;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             range_2.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,"alpha");
  range_2.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_7e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             range_2.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,L"bravo");
  local_7b8._0_8_ = &local_8a8;
  local_7b8._8_8_ = 5;
  init_04._M_len = (size_type)pbVar2;
  init_04._M_array = (iterator)0x5;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_7b8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_7b8._0_8_,init_04);
  local_a10 = (basic_variable<std::allocator<char>_> *)local_7b8;
  do {
    local_a10 = local_a10 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_a10);
  } while (local_a10 != &local_8a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_8f8,(basic_variable<std::allocator<char>_> *)(local_678 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_910,(basic_variable<std::allocator<char>_> *)(local_678 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_928,(basic_variable<std::allocator<char>_> *)(local_7b8 + 0x10));
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_8e0,&local_8f8,&local_910,&local_928);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_928);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_910);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_950,(basic_variable<std::allocator<char>_> *)(local_678 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_968,(iterator *)local_8e0);
  local_938[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_950,&local_968);
  local_96c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x2cd,"void test_array()",local_938,&local_96c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_968);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_950);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_8e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_7b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_678 + 0x10));
  return;
}

Assistant:

void test_array()
{
    {
        variable first = array::make({ true, 2, 3.0, "alpha", L"bravo" });
        variable second = array::make({ true, 2, 3.0, "alpha", L"bravo" });
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST(range.first == first.end());
    }
    {
        variable first = array::make({ true, 2, 3.0, "alpha", L"bravo" });
        variable second = array::make({ 1, 2, 3, "alpha", L"bravo" });
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST(range.first == first.end());
    }
    {
        variable first = array::make({ true, 2, 3.0, "alpha", L"bravo" });
        variable second = array::make({ true, 3.0, 2, "alpha", L"bravo" });
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 1);
    }
}